

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.h
# Opt level: O0

string * __thiscall
google::protobuf::internal::TaggedStringPtr::TagAs(TaggedStringPtr *this,Type type,string *p)

{
  LogMessage *pLVar1;
  LogMessage local_38;
  Voidify local_21;
  string *local_20;
  string *p_local;
  TaggedStringPtr *pTStack_10;
  Type type_local;
  TaggedStringPtr *this_local;
  
  local_20 = p;
  p_local._4_4_ = type;
  pTStack_10 = this;
  if (p != (string *)0x0) {
    assert_aligned(p);
    this->ptr_ = (void *)((ulong)local_20 | (ulong)p_local._4_4_);
    return local_20;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring.h"
             ,0xc1,"p != nullptr");
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_38);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_21,pLVar1);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_38);
}

Assistant:

inline std::string* TagAs(Type type, std::string* p) {
    ABSL_DCHECK(p != nullptr);
    assert_aligned(p);
    ptr_ = reinterpret_cast<void*>(reinterpret_cast<uintptr_t>(p) | type);
    return p;
  }